

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O3

void __thiscall CodeGenerator::writeBeginningOfClass(CodeGenerator *this,ostream *s,Class *clazz)

{
  char cVar1;
  ostream *poVar2;
  long *plVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"class ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (s,(clazz->name)._M_dataplus._M_p,(clazz->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," : public rengine::SignalEmitter",0x20)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"{",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"public:",7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    bool initialized = false;",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    // initialize function..",0x1c);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    void initialize(rengine::ResourceManager *manager)",0x36);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    {",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"        assert(!initialized);",0x1d);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"        initResources(manager);",0x1f);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"        initObjects();",0x16);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  cVar1 = (char)s;
  if ((clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__ostream_insert<char,std::char_traits<char>>(s,"        initReplicators(manager);",0x21);
    std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(s,"        initialized = true;",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)s + -0x18) + cVar1);
  std::ostream::put(cVar1);
  poVar2 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    }",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  plVar3 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
  std::ostream::put((char)plVar3);
  std::ostream::flush();
  return;
}

Assistant:

void CodeGenerator::writeBeginningOfClass(std::ostream &s, Class *clazz)
{
    s << "class " << clazz->name << " : public rengine::SignalEmitter" << std::endl
      << "{" << std::endl
      << "public:" << std::endl
      << "    bool initialized = false;" << std::endl
      << "    // initialize function.." << std::endl
      << "    void initialize(rengine::ResourceManager *manager)" << std::endl
      << "    {" << std::endl
      << "        assert(!initialized);" << std::endl
      << "        initResources(manager);" << std::endl
      << "        initObjects();" << std::endl;
    if (!clazz->replicators.empty())
        s << "        initReplicators(manager);" << std::endl;
    s << "        initialized = true;" << std::endl
      << "    }" << std::endl
      << std::endl;
}